

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void Utils::printSid(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,int pos)

{
  ostream *poVar1;
  reference pvVar2;
  int pos_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vec_local;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)(pos + 3))
  ;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)(pos + 2))
  ;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)(pos + 1))
  ;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)pos);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_1c5dd + 0xf);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)(pos + 5))
  ;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)(pos + 4))
  ;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_1c5dd + 0xf);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)(pos + 7))
  ;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)(pos + 6))
  ;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_1c5dd + 0xf);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)(pos + 8))
  ;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](vec,(long)(pos + 9))
  ;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_1c5dd + 0xf);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (vec,(long)(pos + 10));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (vec,(long)(pos + 0xb));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (vec,(long)(pos + 0xc));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (vec,(long)(pos + 0xd));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (vec,(long)(pos + 0xe));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pvVar2);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (vec,(long)(pos + 0xf));
  std::ostream::operator<<(poVar1,*pvVar2);
  return;
}

Assistant:

void Utils::printSid(std::vector<unsigned int> vec, int pos) {
    cout << hex << vec[pos+3] <<  " " << hex << vec[pos+2] << " " << hex << vec[pos+1] << " " << hex << vec[pos] << " " << "-" << " " <<
            hex << vec[pos+5] << " " << hex << vec[pos+4] << " " << "-" << " " << hex << vec[pos+7] << " " << hex << vec[pos+6] << " " << "-"  << " " <<
            hex << vec[pos+8] << " " << hex << vec[pos+9] << " " << "-" << " " <<
            hex << vec[pos+10] << " " << hex << vec[pos+11] << " " << hex << vec[pos+12] << " " <<
            hex << vec[pos+13] << " " << hex << vec[pos+14] << " " << hex << vec[pos+15];
}